

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

void xdgToplevelHandleConfigure
               (void *userData,xdg_toplevel *toplevel,int32_t width,int32_t height,wl_array *states)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  
  *(undefined8 *)((long)userData + 0x3b0) = 0;
  *(undefined4 *)((long)userData + 0x3a8) = 0;
  if (0 < (long)states->size) {
    piVar3 = (int *)states->data;
    piVar2 = (int *)(states->size + (long)piVar3);
    do {
      iVar1 = *piVar3;
      if (iVar1 == 4) {
        *(undefined4 *)((long)userData + 0x3b0) = 1;
      }
      else if (iVar1 == 2) {
        *(undefined4 *)((long)userData + 0x3b4) = 1;
      }
      else if (iVar1 == 1) {
        *(undefined4 *)((long)userData + 0x3a8) = 1;
      }
      piVar3 = piVar3 + 1;
    } while (piVar3 < piVar2);
  }
  if (height == 0 || width == 0) {
    height = *(int *)((long)userData + 0x35c);
    *(undefined4 *)((long)userData + 0x3a0) = *(undefined4 *)((long)userData + 0x358);
  }
  else if (*(int *)((long)userData + 0x460) == 0) {
    *(int32_t *)((long)userData + 0x3a0) = width;
  }
  else {
    iVar1 = _glfw_max(0,width + -8);
    *(int *)((long)userData + 0x3a0) = iVar1;
    height = _glfw_max(0,height + -0x1c);
  }
  *(int32_t *)((long)userData + 0x3a4) = height;
  return;
}

Assistant:

static void xdgToplevelHandleConfigure(void* userData,
                                       struct xdg_toplevel* toplevel,
                                       int32_t width,
                                       int32_t height,
                                       struct wl_array* states)
{
    _GLFWwindow* window = userData;
    uint32_t* state;

    window->wl.pending.activated  = GLFW_FALSE;
    window->wl.pending.maximized  = GLFW_FALSE;
    window->wl.pending.fullscreen = GLFW_FALSE;

    wl_array_for_each(state, states)
    {
        switch (*state)
        {
            case XDG_TOPLEVEL_STATE_MAXIMIZED:
                window->wl.pending.maximized = GLFW_TRUE;
                break;
            case XDG_TOPLEVEL_STATE_FULLSCREEN:
                window->wl.pending.fullscreen = GLFW_TRUE;
                break;
            case XDG_TOPLEVEL_STATE_RESIZING:
                break;
            case XDG_TOPLEVEL_STATE_ACTIVATED:
                window->wl.pending.activated = GLFW_TRUE;
                break;
        }
    }

    if (width && height)
    {
        if (window->wl.fallback.decorations)
        {
            window->wl.pending.width  = _glfw_max(0, width - GLFW_BORDER_SIZE * 2);
            window->wl.pending.height =
                _glfw_max(0, height - GLFW_BORDER_SIZE - GLFW_CAPTION_HEIGHT);
        }
        else
        {
            window->wl.pending.width  = width;
            window->wl.pending.height = height;
        }
    }
    else
    {
        window->wl.pending.width  = window->wl.width;
        window->wl.pending.height = window->wl.height;
    }
}